

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.c
# Opt level: O0

int enet_address_get_host(ENetAddress *address,char *name,size_t nameLength)

{
  int iVar1;
  void *pvVar2;
  size_t in_RDX;
  char *in_RSI;
  char *in_RDI;
  int err;
  sockaddr_in sin;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffffbc;
  char *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  sockaddr local_30;
  size_t local_20;
  char *local_18;
  char *local_10;
  int local_4;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(&local_30,0,0x10);
  local_30.sa_family = 2;
  local_30.sa_data._0_2_ = htons(*(uint16_t *)(local_10 + 4));
  local_30.sa_data._2_4_ = *(undefined4 *)local_10;
  uVar3 = 8;
  iVar1 = getnameinfo(&local_30,0x10,local_18,(socklen_t)local_20,(char *)0x0,0,8);
  if (iVar1 == 0) {
    if (((local_18 != (char *)0x0) && (local_20 != 0)) &&
       (pvVar2 = memchr(local_18,0,local_20), pvVar2 == (void *)0x0)) {
      return -1;
    }
    local_4 = 0;
  }
  else if (iVar1 == -2) {
    local_4 = enet_address_get_host_ip
                        ((ENetAddress *)CONCAT44(0xfffffffe,in_stack_ffffffffffffffc8),
                         in_stack_ffffffffffffffc0,CONCAT44(in_stack_ffffffffffffffbc,uVar3));
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int
enet_address_get_host (const ENetAddress * address, char * name, size_t nameLength)
{
#ifdef HAS_GETNAMEINFO
    struct sockaddr_in sin;
    int err;

    memset (& sin, 0, sizeof (struct sockaddr_in));

    sin.sin_family = AF_INET;
    sin.sin_port = ENET_HOST_TO_NET_16 (address -> port);
    sin.sin_addr.s_addr = address -> host;

    err = getnameinfo ((struct sockaddr *) & sin, sizeof (sin), name, nameLength, NULL, 0, NI_NAMEREQD);
    if (! err)
    {
        if (name != NULL && nameLength > 0 && ! memchr (name, '\0', nameLength))
          return -1;
        return 0;
    }
    if (err != EAI_NONAME)
      return -1;
#else
    struct in_addr in;
    struct hostent * hostEntry = NULL;
#ifdef HAS_GETHOSTBYADDR_R
    struct hostent hostData;
    char buffer [2048];
    int errnum;

    in.s_addr = address -> host;

#if defined(linux) || defined(__linux) || defined(__linux__) || defined(__FreeBSD__) || defined(__FreeBSD_kernel__) || defined(__DragonFly__) || defined(__GNU__)
    gethostbyaddr_r ((char *) & in, sizeof (struct in_addr), AF_INET, & hostData, buffer, sizeof (buffer), & hostEntry, & errnum);
#else
    hostEntry = gethostbyaddr_r ((char *) & in, sizeof (struct in_addr), AF_INET, & hostData, buffer, sizeof (buffer), & errnum);
#endif
#else
    in.s_addr = address -> host;

    hostEntry = gethostbyaddr ((char *) & in, sizeof (struct in_addr), AF_INET);
#endif

    if (hostEntry != NULL)
    {
       size_t hostLen = strlen (hostEntry -> h_name);
       if (hostLen >= nameLength)
         return -1;
       memcpy (name, hostEntry -> h_name, hostLen + 1);
       return 0;
    }
#endif

    return enet_address_get_host_ip (address, name, nameLength);
}